

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O0

void ev_loop_destroy(ev_loop *loop)

{
  int iVar1;
  int local_14;
  int i;
  ev_loop *loop_local;
  
  if (loop != (ev_loop *)0x0) {
    if (loop->cleanupcnt != 0) {
      queue_events(loop,(W *)loop->cleanups,loop->cleanupcnt,0x40000);
      (*loop->invoke_cb)(loop);
    }
    iVar1 = ev_is_default_loop(loop);
    if ((iVar1 != 0) && (childev.active != 0)) {
      ev_ref(loop);
      ev_signal_stop(loop,&childev);
    }
    if ((loop->pipe_w).active != 0) {
      if (-1 < loop->evpipe[0]) {
        close(loop->evpipe[0]);
      }
      if (-1 < loop->evpipe[1]) {
        close(loop->evpipe[1]);
      }
    }
    if ((loop->sigfd_w).active != 0) {
      close(loop->sigfd);
    }
    if (-1 < loop->fs_fd) {
      close(loop->fs_fd);
    }
    if (-1 < loop->backend_fd) {
      close(loop->backend_fd);
    }
    if (loop->backend == 4) {
      epoll_destroy(loop);
    }
    if (loop->backend == 2) {
      poll_destroy(loop);
    }
    if (loop->backend == 1) {
      select_destroy(loop);
    }
    local_14 = 5;
    while (iVar1 = local_14 + -1, local_14 != 0) {
      ev_realloc(loop->pendings[iVar1],0);
      loop->pendingmax[iVar1] = 0;
      loop->pendingcnt[iVar1] = 0;
      loop->pendings[iVar1] = (ANPENDING *)0x0;
      ev_realloc(loop->idles[iVar1],0);
      loop->idlemax[iVar1] = 0;
      loop->idlecnt[iVar1] = 0;
      loop->idles[iVar1] = (ev_idle **)0x0;
      local_14 = iVar1;
    }
    ev_realloc(loop->anfds,0);
    loop->anfds = (ANFD *)0x0;
    loop->anfdmax = 0;
    ev_realloc(loop->rfeeds,0);
    loop->rfeedmax = 0;
    loop->rfeedcnt = 0;
    loop->rfeeds = (W *)0x0;
    ev_realloc(loop->fdchanges,0);
    loop->fdchangemax = 0;
    loop->fdchangecnt = 0;
    loop->fdchanges = (int *)0x0;
    ev_realloc(loop->timers,0);
    loop->timermax = 0;
    loop->timercnt = 0;
    loop->timers = (ANHE *)0x0;
    ev_realloc(loop->periodics,0);
    loop->periodicmax = 0;
    loop->periodiccnt = 0;
    loop->periodics = (ANHE *)0x0;
    ev_realloc(loop->forks,0);
    loop->forkmax = 0;
    loop->forkcnt = 0;
    loop->forks = (ev_fork **)0x0;
    ev_realloc(loop->cleanups,0);
    loop->cleanupmax = 0;
    loop->cleanupcnt = 0;
    loop->cleanups = (ev_cleanup **)0x0;
    ev_realloc(loop->prepares,0);
    loop->preparemax = 0;
    loop->preparecnt = 0;
    loop->prepares = (ev_prepare **)0x0;
    ev_realloc(loop->checks,0);
    loop->checkmax = 0;
    loop->checkcnt = 0;
    loop->checks = (ev_check **)0x0;
    ev_realloc(loop->asyncs,0);
    loop->asyncmax = 0;
    loop->asynccnt = 0;
    loop->asyncs = (ev_async **)0x0;
    loop->backend = 0;
    iVar1 = ev_is_default_loop(loop);
    if (iVar1 == 0) {
      ev_realloc(loop,0);
    }
    else {
      ev_default_loop_ptr = (ev_loop *)0x0;
    }
  }
  return;
}

Assistant:

void ecb_cold
ev_loop_destroy (EV_P)
{
  int i;

#if EV_MULTIPLICITY
  /* mimic free (0) */
  if (!EV_A)
    return;
#endif

#if EV_CLEANUP_ENABLE
  /* queue cleanup watchers (and execute them) */
  if (expect_false (cleanupcnt))
    {
      queue_events (EV_A_ (W *)cleanups, cleanupcnt, EV_CLEANUP);
      EV_INVOKE_PENDING;
    }
#endif

#if EV_CHILD_ENABLE
  if (ev_is_default_loop (EV_A) && ev_is_active (&childev))
    {
      ev_ref (EV_A); /* child watcher */
      ev_signal_stop (EV_A_ &childev);
    }
#endif

  if (ev_is_active (&pipe_w))
    {
      /*ev_ref (EV_A);*/
      /*ev_io_stop (EV_A_ &pipe_w);*/

      if (evpipe [0] >= 0) EV_WIN32_CLOSE_FD (evpipe [0]);
      if (evpipe [1] >= 0) EV_WIN32_CLOSE_FD (evpipe [1]);
    }

#if EV_USE_SIGNALFD
  if (ev_is_active (&sigfd_w))
    close (sigfd);
#endif

#if EV_USE_INOTIFY
  if (fs_fd >= 0)
    close (fs_fd);
#endif

  if (backend_fd >= 0)
    close (backend_fd);

#if EV_USE_IOCP
  if (backend == EVBACKEND_IOCP  ) iocp_destroy   (EV_A);
#endif
#if EV_USE_PORT
  if (backend == EVBACKEND_PORT  ) port_destroy   (EV_A);
#endif
#if EV_USE_KQUEUE
  if (backend == EVBACKEND_KQUEUE) kqueue_destroy (EV_A);
#endif
#if EV_USE_EPOLL
  if (backend == EVBACKEND_EPOLL ) epoll_destroy  (EV_A);
#endif
#if EV_USE_POLL
  if (backend == EVBACKEND_POLL  ) poll_destroy   (EV_A);
#endif
#if EV_USE_SELECT
  if (backend == EVBACKEND_SELECT) select_destroy (EV_A);
#endif

  for (i = NUMPRI; i--; )
    {
      array_free (pending, [i]);
#if EV_IDLE_ENABLE
      array_free (idle, [i]);
#endif
    }

  ev_free (anfds); anfds = 0; anfdmax = 0;

  /* have to use the microsoft-never-gets-it-right macro */
  array_free (rfeed, EMPTY);
  array_free (fdchange, EMPTY);
  array_free (timer, EMPTY);
#if EV_PERIODIC_ENABLE
  array_free (periodic, EMPTY);
#endif
#if EV_FORK_ENABLE
  array_free (fork, EMPTY);
#endif
#if EV_CLEANUP_ENABLE
  array_free (cleanup, EMPTY);
#endif
  array_free (prepare, EMPTY);
  array_free (check, EMPTY);
#if EV_ASYNC_ENABLE
  array_free (async, EMPTY);
#endif

  backend = 0;

#if EV_MULTIPLICITY
  if (ev_is_default_loop (EV_A))
#endif
    ev_default_loop_ptr = 0;
#if EV_MULTIPLICITY
  else
    ev_free (EV_A);
#endif
}